

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O3

vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
* embree::SceneGraph::transformMSMBlurNormalBuffer<embree::Vec3fa>
            (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             *__return_storage_ptr__,
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            *normals_in,Transformations *spaces)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  float *pfVar2;
  Vector *pVVar3;
  pointer pvVar4;
  pointer pvVar5;
  size_t sVar6;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar7;
  Vec3fa *pVVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  long lVar18;
  long lVar19;
  size_t sVar20;
  ulong uVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar32;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar33;
  float fVar35;
  undefined1 auVar31 [16];
  AffineSpace3ff space;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> local_98;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_78;
  undefined8 uStack_68;
  void *pvStack_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  
  pvVar4 = (normals_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar5 = (normals_in->
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar5 == pvVar4) {
    std::
    vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    ::vector(__return_storage_ptr__,normals_in);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar6 = pvVar4->size_active;
    if ((long)pvVar5 - (long)pvVar4 == 0x20) {
      if ((spaces->spaces).size_active != 0) {
        uVar21 = 0;
        do {
          local_78._8_8_ = 0;
          uStack_68 = 0;
          pvStack_60 = (void *)0x0;
          if (sVar6 != 0) {
            pvStack_60 = alignedMalloc(sVar6 << 4,0x10);
            lVar18 = 0;
            sVar20 = sVar6;
            do {
              pAVar7 = (spaces->spaces).items;
              pAVar1 = pAVar7 + uVar21;
              fVar33 = (pAVar1->l).vx.field_0.m128[0];
              fVar35 = (pAVar1->l).vx.field_0.m128[1];
              fVar22 = (pAVar1->l).vx.field_0.m128[2];
              pVVar3 = &pAVar7[uVar21].l.vy;
              fVar12 = (pVVar3->field_0).m128[0];
              fVar13 = (pVVar3->field_0).m128[1];
              fVar14 = (pVVar3->field_0).m128[2];
              pVVar3 = &pAVar7[uVar21].l.vz;
              fVar15 = (pVVar3->field_0).m128[0];
              fVar16 = (pVVar3->field_0).m128[1];
              fVar17 = (pVVar3->field_0).m128[2];
              pVVar8 = ((normals_in->
                        super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->items;
              auVar29._0_4_ = fVar12 * fVar16 - fVar13 * fVar15;
              fVar32 = fVar13 * fVar17 - fVar14 * fVar16;
              fVar34 = fVar14 * fVar15 - fVar12 * fVar17;
              auVar23._4_4_ = fVar17 * fVar33 - fVar15 * fVar22;
              auVar23._0_4_ = fVar34;
              auVar23._8_4_ = fVar22 * fVar12 - fVar33 * fVar14;
              auVar23._12_4_ = 0;
              auVar26._4_4_ = fVar16 * fVar22 - fVar17 * fVar35;
              auVar26._0_4_ = fVar32;
              auVar26._8_4_ = fVar35 * fVar14 - fVar22 * fVar13;
              auVar26._12_4_ = 0;
              fVar22 = fVar22 * auVar29._0_4_ + fVar35 * fVar34 + fVar33 * fVar32;
              auVar29._4_4_ = fVar15 * fVar35 - fVar16 * fVar33;
              auVar29._8_4_ = fVar33 * fVar13 - fVar35 * fVar12;
              auVar29._12_4_ = 0;
              auVar9._4_4_ = fVar22;
              auVar9._0_4_ = fVar22;
              auVar9._8_4_ = fVar22;
              auVar9._12_4_ = fVar22;
              auVar27 = divps(auVar26,auVar9);
              auVar10._4_4_ = fVar22;
              auVar10._0_4_ = fVar22;
              auVar10._8_4_ = fVar22;
              auVar10._12_4_ = fVar22;
              auVar24 = divps(auVar23,auVar10);
              auVar11._4_4_ = fVar22;
              auVar11._0_4_ = fVar22;
              auVar11._8_4_ = fVar22;
              auVar11._12_4_ = fVar22;
              auVar30 = divps(auVar29,auVar11);
              fVar33 = *(float *)((long)&pVVar8->field_0 + lVar18);
              fVar35 = *(float *)((long)&pVVar8->field_0 + lVar18 + 4);
              fVar22 = *(float *)((long)&pVVar8->field_0 + lVar18 + 8);
              pfVar2 = (float *)((long)pvStack_60 + lVar18);
              *pfVar2 = fVar22 * auVar27._8_4_ + fVar35 * auVar27._4_4_ + fVar33 * auVar27._0_4_;
              pfVar2[1] = fVar22 * auVar24._8_4_ + fVar35 * auVar24._4_4_ + fVar33 * auVar24._0_4_;
              pfVar2[2] = fVar22 * auVar30._8_4_ + fVar35 * auVar30._4_4_ + fVar33 * auVar30._0_4_;
              pfVar2[3] = fVar22 * 0.0 + fVar35 * 0.0 + fVar33 * 0.0;
              lVar18 = lVar18 + 0x10;
              sVar20 = sVar20 - 1;
              uStack_68 = sVar6;
            } while (sVar20 != 0);
          }
          local_78._8_8_ = uStack_68;
          std::
          vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
          ::
          emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                    ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                      *)__return_storage_ptr__,
                     (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                     &local_78.field_1);
          alignedFree(pvStack_60);
          uVar21 = uVar21 + 1;
        } while (uVar21 < (spaces->spaces).size_active);
      }
    }
    else {
      lVar18 = (long)pvVar5 - (long)pvVar4 >> 5;
      uVar21 = 0;
      do {
        Transformations::interpolate
                  ((AffineSpace3ff *)&local_78.field_1,spaces,(float)uVar21 / (float)(lVar18 - 1));
        local_98.size_active = 0;
        local_98.size_alloced = 0;
        local_98.items = (Vec3fa *)0x0;
        if (sVar6 != 0) {
          local_98.items = (Vec3fa *)alignedMalloc(sVar6 << 4,0x10);
          lVar19 = 0;
          sVar20 = sVar6;
          do {
            pVVar8 = (normals_in->
                     super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[uVar21].items;
            auVar31._0_4_ = (float)uStack_68 * fStack_54 - uStack_68._4_4_ * local_58;
            fVar33 = uStack_68._4_4_ * fStack_50 - pvStack_60._0_4_ * fStack_54;
            fVar35 = pvStack_60._0_4_ * local_58 - (float)uStack_68 * fStack_50;
            auVar25._4_4_ = fStack_50 * local_78.m128[0] - local_58 * local_78.m128[2];
            auVar25._0_4_ = fVar35;
            auVar25._8_4_ =
                 local_78.m128[2] * (float)uStack_68 - local_78.m128[0] * pvStack_60._0_4_;
            auVar25._12_4_ = 0;
            auVar28._4_4_ = fStack_54 * local_78.m128[2] - fStack_50 * local_78.m128[1];
            auVar28._0_4_ = fVar33;
            auVar28._8_4_ = local_78.m128[1] * pvStack_60._0_4_ - local_78.m128[2] * uStack_68._4_4_
            ;
            auVar28._12_4_ = 0;
            fVar33 = local_78.m128[2] * auVar31._0_4_ +
                     local_78.m128[1] * fVar35 + local_78.m128[0] * fVar33;
            auVar31._4_4_ = local_58 * local_78.m128[1] - fStack_54 * local_78.m128[0];
            auVar31._8_4_ = local_78.m128[0] * uStack_68._4_4_ - local_78.m128[1] * (float)uStack_68
            ;
            auVar31._12_4_ = 0;
            auVar24._4_4_ = fVar33;
            auVar24._0_4_ = fVar33;
            auVar24._8_4_ = fVar33;
            auVar24._12_4_ = fVar33;
            auVar28 = divps(auVar28,auVar24);
            auVar27._4_4_ = fVar33;
            auVar27._0_4_ = fVar33;
            auVar27._8_4_ = fVar33;
            auVar27._12_4_ = fVar33;
            auVar24 = divps(auVar25,auVar27);
            auVar30._4_4_ = fVar33;
            auVar30._0_4_ = fVar33;
            auVar30._8_4_ = fVar33;
            auVar30._12_4_ = fVar33;
            auVar27 = divps(auVar31,auVar30);
            fVar33 = *(float *)((long)&pVVar8->field_0 + lVar19);
            fVar35 = *(float *)((long)&pVVar8->field_0 + lVar19 + 4);
            fVar22 = *(float *)((long)&pVVar8->field_0 + lVar19 + 8);
            pfVar2 = (float *)((long)&(local_98.items)->field_0 + lVar19);
            *pfVar2 = fVar22 * auVar28._8_4_ + fVar35 * auVar28._4_4_ + fVar33 * auVar28._0_4_;
            pfVar2[1] = fVar22 * auVar24._8_4_ + fVar35 * auVar24._4_4_ + fVar33 * auVar24._0_4_;
            pfVar2[2] = fVar22 * auVar27._8_4_ + fVar35 * auVar27._4_4_ + fVar33 * auVar27._0_4_;
            pfVar2[3] = fVar22 * 0.0 + fVar35 * 0.0 + fVar33 * 0.0;
            lVar19 = lVar19 + 0x10;
            sVar20 = sVar20 - 1;
            local_98.size_alloced = sVar6;
          } while (sVar20 != 0);
        }
        local_98.size_active = local_98.size_alloced;
        std::
        vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
        ::
        emplace_back<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>
                  ((vector<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>,std::allocator<embree::vector_t<embree::Vec3fa,embree::aligned_allocator<embree::Vec3fa,16ul>>>>
                    *)__return_storage_ptr__,&local_98);
        alignedFree(local_98.items);
        uVar21 = uVar21 + 1;
      } while (uVar21 != lVar18 + (ulong)(lVar18 == 0));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<avector<Vertex>> transformMSMBlurNormalBuffer(const std::vector<avector<Vertex>>& normals_in, const Transformations& spaces)
    {
      if (normals_in.size() == 0)
        return normals_in;
      
      std::vector<avector<Vertex>> normals_out;
      const size_t num_time_steps = normals_in.size();
      const size_t num_vertices = normals_in[0].size();

      /* if we have only one set of vertices, use transformation to generate more vertex sets */
      if (num_time_steps == 1)
      {
        for (size_t i=0; i<spaces.size(); i++) 
        {
          avector<Vertex> norms(num_vertices);
          for (size_t j=0; j<num_vertices; j++) {
            norms[j] = xfmNormal((AffineSpace3fa)spaces[i],normals_in[0][j]);
          }
          normals_out.push_back(std::move(norms));
        }
      } 
      /* otherwise transform all vertex sets with interpolated transformation */
      else
      {
        for (size_t t=0; t<num_time_steps; t++) 
        {
          float time = num_time_steps > 1 ? float(t)/float(num_time_steps-1) : 0.0f;
          const AffineSpace3ff space = spaces.interpolate(time);
          avector<Vertex> norms(num_vertices);
          for (size_t i=0; i<num_vertices; i++) {
            norms[i] = xfmNormal ((AffineSpace3fa)space,normals_in[t][i]);
          }
          normals_out.push_back(std::move(norms));
        }
      }
      return normals_out;
    }